

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_mffscrni(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 t1_00;
  TCGv_i64 t1;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->insns_flags2 & 0x80000) != 0) {
    if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
      uVar1 = RM(ctx->opcode);
      t1_00 = tcg_const_i64_ppc64(tcg_ctx_00,(ulong)uVar1);
      gen_helper_mffscrn(ctx,t1_00);
      tcg_temp_free_i64(tcg_ctx_00,t1_00);
    }
    else {
      gen_exception(ctx,7);
    }
  }
  return;
}

Assistant:

static void gen_mffscrni(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t1;

    if (unlikely(!(ctx->insns_flags2 & PPC2_ISA300))) {
        return;
    }

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }

    t1 = tcg_const_i64(tcg_ctx, (uint64_t)RM(ctx->opcode));

    gen_helper_mffscrn(ctx, t1);

    tcg_temp_free_i64(tcg_ctx, t1);
}